

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestTestHandler::GetValue(cmCTestTestHandler *this,char *tag,bool *value,istream *fin)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  bool local_55;
  bool ret;
  undefined1 local_48 [8];
  string line;
  istream *fin_local;
  bool *value_local;
  char *tag_local;
  cmCTestTestHandler *this_local;
  
  line.field_2._8_8_ = fin;
  std::__cxx11::string::string((string *)local_48);
  cmsys::SystemTools::GetLineFromStream
            ((istream *)line.field_2._8_8_,(string *)local_48,(bool *)0x0,0xffffffffffffffff);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,tag);
  if (bVar1) {
    std::istream::operator>>((void *)line.field_2._8_8_,value);
    local_55 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)line.field_2._8_8_,(string *)local_48,(bool *)0x0,
                          0xffffffffffffffff);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    poVar2 = std::operator<<((ostream *)local_1d0,"parse error: missing tag: ");
    poVar2 = std::operator<<(poVar2,tag);
    poVar2 = std::operator<<(poVar2," found [");
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x52b,msg,false);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    local_55 = false;
  }
  std::__cxx11::string::~string((string *)local_48);
  return local_55;
}

Assistant:

bool cmCTestTestHandler::GetValue(const char* tag, bool& value,
                                  std::istream& fin)
{
  std::string line;
  cmSystemTools::GetLineFromStream(fin, line);
  bool ret = true;
  if (line == tag) {
#ifdef __HAIKU__
    int tmp = 0;
    fin >> tmp;
    value = false;
    if (tmp) {
      value = true;
    }
#else
    fin >> value;
#endif
    ret = cmSystemTools::GetLineFromStream(fin, line); // read blank line
  } else {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "parse error: missing tag: " << tag << " found [" << line << "]"
                                            << std::endl);
    ret = false;
  }
  return ret;
}